

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O1

int mbedtls_blowfish_crypt_ctr
              (mbedtls_blowfish_context *ctx,size_t length,size_t *nc_off,uchar *nonce_counter,
              uchar *stream_block,uchar *input,uchar *output)

{
  uchar *puVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar6 = *nc_off;
  iVar4 = -0x16;
  if (uVar6 < 8) {
    if (length != 0) {
      do {
        if (uVar6 == 0) {
          mbedtls_blowfish_crypt_ecb(ctx,1,nonce_counter,stream_block);
          uVar5 = 8;
          do {
            puVar1 = nonce_counter + ((ulong)uVar5 - 1);
            *puVar1 = *puVar1 + '\x01';
            if (*puVar1 != '\0') break;
            bVar3 = 1 < uVar5;
            uVar5 = uVar5 - 1;
          } while (bVar3);
        }
        length = length - 1;
        bVar2 = *input;
        input = input + 1;
        *output = stream_block[uVar6] ^ bVar2;
        output = output + 1;
        uVar6 = (ulong)((int)uVar6 + 1U & 7);
      } while (length != 0);
    }
    *nc_off = uVar6;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int mbedtls_blowfish_crypt_ctr( mbedtls_blowfish_context *ctx,
                       size_t length,
                       size_t *nc_off,
                       unsigned char nonce_counter[MBEDTLS_BLOWFISH_BLOCKSIZE],
                       unsigned char stream_block[MBEDTLS_BLOWFISH_BLOCKSIZE],
                       const unsigned char *input,
                       unsigned char *output )
{
    int c, i;
    size_t n;
    BLOWFISH_VALIDATE_RET( ctx != NULL );
    BLOWFISH_VALIDATE_RET( nonce_counter != NULL );
    BLOWFISH_VALIDATE_RET( stream_block  != NULL );
    BLOWFISH_VALIDATE_RET( nc_off != NULL );
    BLOWFISH_VALIDATE_RET( length == 0 || input  != NULL );
    BLOWFISH_VALIDATE_RET( length == 0 || output != NULL );

    n = *nc_off;
    if( n >= 8 )
        return( MBEDTLS_ERR_BLOWFISH_BAD_INPUT_DATA );

    while( length-- )
    {
        if( n == 0 ) {
            mbedtls_blowfish_crypt_ecb( ctx, MBEDTLS_BLOWFISH_ENCRYPT, nonce_counter,
                                stream_block );

            for( i = MBEDTLS_BLOWFISH_BLOCKSIZE; i > 0; i-- )
                if( ++nonce_counter[i - 1] != 0 )
                    break;
        }
        c = *input++;
        *output++ = (unsigned char)( c ^ stream_block[n] );

        n = ( n + 1 ) % MBEDTLS_BLOWFISH_BLOCKSIZE;
    }

    *nc_off = n;

    return( 0 );
}